

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O3

void __thiscall
amrex::MLEBABecLap::interpolation
          (MLEBABecLap *this,int amrlev,int fmglev,MultiFab *fine,MultiFab *crse)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  FabType FVar4;
  long lVar5;
  int *piVar6;
  uint32_t *puVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  bool bVar13;
  MFIter mfi;
  ulong local_1e0;
  ulong local_1d0;
  FabArray<amrex::EBCellFlagFab> *local_1c8;
  long local_1c0;
  long local_1b8;
  Box local_184;
  FabArray<amrex::FArrayBox> *local_168;
  ulong local_160;
  long local_158;
  Array4<double> local_150;
  Array4<const_double> local_110;
  Array4<const_amrex::EBCellFlag> local_d0;
  MFIter local_90;
  
  lVar5 = *(long *)(*(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory.
                              super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[amrlev].
                              super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                              .
                              super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                   + (long)fmglev * 8);
  local_168 = &crse->super_FabArray<amrex::FArrayBox>;
  if (lVar5 == 0) {
    local_1c8 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    local_1c8 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    lVar5 = __dynamic_cast(lVar5,&FabFactory<amrex::FArrayBox>::typeinfo,
                           &EBFArrayBoxFactory::typeinfo,0);
    if (lVar5 != 0) {
      local_1c8 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar5 + 0xd8));
    }
  }
  uVar3 = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])(this);
  MFIter::MFIter(&local_90,(FabArrayBase *)fine,true);
  if (local_90.currentIndex < local_90.endIndex) {
    local_160 = (ulong)uVar3;
    do {
      MFIter::tilebox(&local_184,&local_90);
      if (local_1c8 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_110,local_168,&local_90)
        ;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_150,&fine->super_FabArray<amrex::FArrayBox>,&local_90);
LAB_006d1e79:
        if (0 < (int)uVar3) {
          local_1c0 = 0;
          local_1e0 = 0;
          do {
            iVar1 = local_184.smallend.vect[2];
            if (local_184.smallend.vect[2] <= local_184.bigend.vect[2]) {
              do {
                if (local_184.smallend.vect[1] <= local_184.bigend.vect[1]) {
                  pdVar8 = (double *)
                           ((long)local_150.p +
                           local_150.nstride * local_1c0 +
                           ((long)local_184.smallend.vect[1] - (long)local_150.begin.y) *
                           local_150.jstride * 8 +
                           ((long)iVar1 - (long)local_150.begin.z) * local_150.kstride * 8 +
                           (long)local_150.begin.x * -8 + (long)local_184.smallend.vect[0] * 8);
                  lVar5 = (long)local_184.smallend.vect[1];
                  do {
                    if (local_184.smallend.vect[0] <= local_184.bigend.vect[0]) {
                      pdVar9 = pdVar8;
                      iVar12 = local_184.smallend.vect[0];
                      do {
                        *pdVar9 = local_110.p
                                  [((long)(iVar1 >> 1) - (long)local_110.begin.z) *
                                   local_110.kstride +
                                   local_110.nstride * local_1e0 +
                                   ((long)((int)lVar5 >> 1) - (long)local_110.begin.y) *
                                   local_110.jstride +
                                   ((long)(iVar12 >> 1) - (long)local_110.begin.x)] + *pdVar9;
                        iVar12 = iVar12 + 1;
                        pdVar9 = pdVar9 + 1;
                      } while (local_184.bigend.vect[0] + 1U != iVar12);
                    }
                    lVar5 = lVar5 + 1;
                    pdVar8 = pdVar8 + local_150.jstride;
                  } while (local_184.bigend.vect[1] + 1 != (int)lVar5);
                }
                bVar13 = iVar1 != local_184.bigend.vect[2];
                iVar1 = iVar1 + 1;
              } while (bVar13);
            }
            local_1e0 = local_1e0 + 1;
            local_1c0 = local_1c0 + 8;
          } while (local_1e0 != local_160);
        }
      }
      else {
        piVar6 = &local_90.currentIndex;
        if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar6 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start + local_90.currentIndex;
        }
        FVar4 = EBCellFlagFab::getType
                          ((local_1c8->m_fabs_v).
                           super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[*piVar6],&local_184);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_110,local_168,&local_90)
        ;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_150,&fine->super_FabArray<amrex::FArrayBox>,&local_90);
        if (FVar4 == singlevalued) {
          FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                    (&local_d0,local_1c8,&local_90);
          if (0 < (int)uVar3) {
            lVar5 = (long)local_184.smallend.vect[0];
            local_158 = lVar5 * 4;
            local_1b8 = 0;
            local_1d0 = 0;
            do {
              iVar1 = local_184.smallend.vect[2];
              if (local_184.smallend.vect[2] <= local_184.bigend.vect[2]) {
                do {
                  if (local_184.smallend.vect[1] <= local_184.bigend.vect[1]) {
                    puVar7 = (uint32_t *)
                             ((long)&local_d0.p
                                     [lVar5 + (((long)iVar1 - (long)local_d0.begin.z) *
                                               local_d0.kstride - (long)local_d0.begin.x)].flag +
                             ((long)local_184.smallend.vect[1] - (long)local_d0.begin.y) *
                             local_d0.jstride * 4);
                    lVar11 = (long)local_184.smallend.vect[1];
                    do {
                      if (local_184.smallend.vect[0] <= local_184.bigend.vect[0]) {
                        lVar2 = local_150.nstride * local_1b8 +
                                ((long)iVar1 - (long)local_150.begin.z) * local_150.kstride * 8 +
                                (lVar11 - local_150.begin.y) * local_150.jstride * 8 +
                                (long)local_150.begin.x * -8 + lVar5 * 8;
                        lVar10 = 0;
                        do {
                          if ((~puVar7[lVar10] & 3) != 0) {
                            *(double *)((long)local_150.p + lVar10 * 8 + lVar2) =
                                 local_110.p
                                 [((long)((int)lVar11 >> 1) - (long)local_110.begin.y) *
                                  local_110.jstride +
                                  ((long)(iVar1 >> 1) - (long)local_110.begin.z) * local_110.kstride
                                  + local_110.nstride * local_1d0 +
                                    ((long)(local_184.smallend.vect[0] + (int)lVar10 >> 1) -
                                    (long)local_110.begin.x)] +
                                 *(double *)((long)local_150.p + lVar10 * 8 + lVar2);
                          }
                          lVar10 = lVar10 + 1;
                        } while (~local_184.bigend.vect[0] + local_184.smallend.vect[0] +
                                 (int)lVar10 != 0);
                      }
                      lVar11 = lVar11 + 1;
                      puVar7 = puVar7 + local_d0.jstride;
                    } while (local_184.bigend.vect[1] + 1 != (int)lVar11);
                  }
                  bVar13 = iVar1 != local_184.bigend.vect[2];
                  iVar1 = iVar1 + 1;
                } while (bVar13);
              }
              local_1d0 = local_1d0 + 1;
              local_1b8 = local_1b8 + 8;
            } while (local_1d0 != local_160);
          }
        }
        else if (FVar4 == regular) goto LAB_006d1e79;
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MLEBABecLap::interpolation (int amrlev, int fmglev, MultiFab& fine, const MultiFab& crse) const
{
    BL_PROFILE("MLEBABecLap::interpolation()");

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][fmglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    const int ncomp = getNComp();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(fine,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        auto fabtyp = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;

        Array4<Real const> const& cfab = crse.const_array(mfi);
        Array4<Real> const& ffab = fine.array(mfi);

        if (fabtyp == FabType::regular)
        {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                int ic = amrex::coarsen(i,2);
                int jc = amrex::coarsen(j,2);
                int kc = amrex::coarsen(k,2);
                ffab(i,j,k,n) += cfab(ic,jc,kc,n);
            });
        }
        else if (fabtyp == FabType::singlevalued)
        {
            Array4<EBCellFlag const> const& flg = flags->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                if (!flg(i,j,k).isCovered()) {
                    int ic = amrex::coarsen(i,2);
                    int jc = amrex::coarsen(j,2);
                    int kc = amrex::coarsen(k,2);
                    ffab(i,j,k,n) += cfab(ic,jc,kc,n);
                }
            });
        }
    }
}